

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_model_v2.c
# Opt level: O0

MPP_RET rc_model_v2_start(void *ctx,EncRcTask *task)

{
  EncFrmStatus *pEVar1;
  EncRcTaskInfo *cfg;
  EncFrmType EVar2;
  RK_S32 local_44;
  RcCfg *usr_cfg;
  EncRcTaskInfo *info;
  EncFrmStatus *frm;
  RcModelV2Ctx *p;
  EncRcTask *task_local;
  void *ctx_local;
  
  pEVar1 = &task->frm;
  cfg = &task->info;
  if ((rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc_model_v2","enter %p\n","rc_model_v2_start",ctx);
  }
  if (*(int *)((long)ctx + 8) == 2) {
    if (*(int *)((long)ctx + 0x5c) < 1) {
      _mpp_log_l(4,"rc_model_v2","invalid fix %d qp found set default qp 26\n",(char *)0x0,
                 (ulong)*(uint *)((long)ctx + 0x5c));
      *(undefined4 *)((long)ctx + 0x5c) = 0x1a;
    }
    if (*(int *)((long)ctx + 0x60) < 1) {
      *(undefined4 *)((long)ctx + 0x60) = *(undefined4 *)((long)ctx + 0x5c);
    }
    if (*(int *)((long)ctx + 100) < 1) {
      *(undefined4 *)((long)ctx + 100) = *(undefined4 *)((long)ctx + 0x5c);
    }
    if (*(int *)((long)ctx + 0x68) < 1) {
      *(undefined4 *)((long)ctx + 0x68) = *(undefined4 *)((long)ctx + 0x60);
    }
    if (*(int *)((long)ctx + 0x6c) < 1) {
      *(undefined4 *)((long)ctx + 0x6c) = *(undefined4 *)((long)ctx + 100);
    }
    if ((pEVar1->val >> 4 & 1) == 0) {
      (task->info).quality_max = *(RK_S32 *)((long)ctx + 0x60);
      (task->info).quality_min = *(RK_S32 *)((long)ctx + 100);
      (task->info).quality_target = *(RK_S32 *)((long)ctx + 0x5c);
    }
    else {
      (task->info).quality_max = *(RK_S32 *)((long)ctx + 0x68);
      (task->info).quality_min = *(RK_S32 *)((long)ctx + 0x6c);
      (task->info).quality_target = *(RK_S32 *)((long)ctx + 0x5c);
    }
    if ((rc_debug & 0x40) != 0) {
      _mpp_log_l(4,"rc_model_v2","seq_idx %d intra %d\n","rc_model_v2_start",pEVar1->val >> 0x30,
                 (ulong)((uint)(pEVar1->val >> 4) & 1));
    }
    if ((rc_debug & 0x40) != 0) {
      _mpp_log_l(4,"rc_model_v2","bitrate [%d : %d : %d]\n","rc_model_v2_start",
                 (ulong)(uint)(task->info).bit_min,(ulong)(uint)(task->info).bit_target,
                 (task->info).bit_max);
    }
    if ((rc_debug & 0x40) != 0) {
      _mpp_log_l(4,"rc_model_v2","quality [%d : %d : %d]\n","rc_model_v2_start",
                 (ulong)(uint)(task->info).quality_min,(ulong)(uint)(task->info).quality_target,
                 (task->info).quality_max);
    }
  }
  else {
    if (*(int *)((long)ctx + 0x18) != 0) {
      fps_chg_update_mode((RcModelV2Ctx *)ctx);
    }
    EVar2 = INTER_P_FRAME;
    if ((pEVar1->val >> 4 & 1) != 0) {
      EVar2 = INTRA_FRAME;
    }
    cfg->frame_type = EVar2;
    if (((uint)(pEVar1->val >> 0x10) & 0x3f) == 3) {
      cfg->frame_type = INTER_VI_FRAME;
    }
    if ((pEVar1->val >> 0x26 & 1) != 0) {
      cfg->frame_type = INTRA_RFH_FRAME;
    }
    *(undefined4 *)((long)ctx + 0x230) = 0;
    if (*(int *)((long)ctx + 0x104) == 2) {
      calc_next_i_ratio((RcModelV2Ctx *)ctx);
    }
    if (*(int *)((long)ctx + 0x114) == 0) {
      if (*(long *)((long)ctx + 0x2a8) != 0) {
        (**(code **)((long)ctx + 0x2a8))(ctx,cfg);
      }
    }
    else {
      bits_model_alloc((RcModelV2Ctx *)ctx,cfg,*(RK_S64 *)((long)ctx + 0x108));
      if (*(int *)((long)ctx + 0x5c) < 1) {
        local_44 = -1;
      }
      else {
        local_44 = *(RK_S32 *)((long)ctx + 0x5c);
      }
      (task->info).quality_target = local_44;
    }
    if ((pEVar1->val >> 4 & 1) == 0) {
      (task->info).quality_max = *(RK_S32 *)((long)ctx + 0x60);
      (task->info).quality_min = *(RK_S32 *)((long)ctx + 100);
    }
    else {
      (task->info).quality_max = *(RK_S32 *)((long)ctx + 0x68);
      (task->info).quality_min = *(RK_S32 *)((long)ctx + 0x6c);
    }
    bits_model_preset((RcModelV2Ctx *)ctx,cfg);
    if ((rc_debug & 0x40) != 0) {
      _mpp_log_l(4,"rc_model_v2","seq_idx %d intra %d\n","rc_model_v2_start",pEVar1->val >> 0x30,
                 (ulong)((uint)(pEVar1->val >> 4) & 1));
    }
    if ((rc_debug & 0x40) != 0) {
      _mpp_log_l(4,"rc_model_v2","bitrate [%d : %d : %d]\n","rc_model_v2_start",
                 (ulong)(uint)(task->info).bit_min,(ulong)(uint)(task->info).bit_target,
                 (task->info).bit_max);
    }
    if ((rc_debug & 0x40) != 0) {
      _mpp_log_l(4,"rc_model_v2","quality [%d : %d : %d]\n","rc_model_v2_start",
                 (ulong)(uint)(task->info).quality_min,(ulong)(uint)(task->info).quality_target,
                 (task->info).quality_max);
    }
    *(undefined4 *)((long)ctx + 0x268) = 0;
    *(EncFrmType *)((long)ctx + 0x104) = cfg->frame_type;
    if ((rc_debug & 1) != 0) {
      _mpp_log_l(4,"rc_model_v2","leave %p\n","rc_model_v2_start",ctx);
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET rc_model_v2_start(void *ctx, EncRcTask *task)
{
    RcModelV2Ctx *p = (RcModelV2Ctx*)ctx;
    EncFrmStatus *frm = &task->frm;
    EncRcTaskInfo *info = &task->info;
    RcCfg *usr_cfg = &p->usr_cfg;

    rc_dbg_func("enter %p\n", ctx);

    if (usr_cfg->mode == RC_FIXQP) {
        if (usr_cfg->init_quality <= 0) {
            mpp_log("invalid fix %d qp found set default qp 26\n",
                    usr_cfg->init_quality);
            usr_cfg->init_quality = 26;
        }

        if (usr_cfg->max_quality <= 0)
            usr_cfg->max_quality = usr_cfg->init_quality;
        if (usr_cfg->min_quality <= 0)
            usr_cfg->min_quality = usr_cfg->init_quality;
        if (usr_cfg->max_i_quality <= 0)
            usr_cfg->max_i_quality = usr_cfg->max_quality;
        if (usr_cfg->min_i_quality <= 0)
            usr_cfg->min_i_quality = usr_cfg->min_quality;

        if (frm->is_intra) {
            info->quality_max = usr_cfg->max_i_quality;
            info->quality_min = usr_cfg->min_i_quality;
            info->quality_target = usr_cfg->init_quality;
        } else {
            info->quality_max = usr_cfg->max_quality;
            info->quality_min = usr_cfg->min_quality;
            info->quality_target = usr_cfg->init_quality;
        }

        rc_dbg_rc("seq_idx %d intra %d\n", frm->seq_idx, frm->is_intra);
        rc_dbg_rc("bitrate [%d : %d : %d]\n", info->bit_min, info->bit_target, info->bit_max);
        rc_dbg_rc("quality [%d : %d : %d]\n", info->quality_min, info->quality_target, info->quality_max);

        return MPP_OK;
    }

    if (usr_cfg->fps.fps_out_flex) {
        fps_chg_update_mode(ctx);
    }

    info->frame_type = (frm->is_intra) ? (INTRA_FRAME) : (INTER_P_FRAME);

    if (frm->ref_mode == REF_TO_PREV_INTRA)
        info->frame_type = INTER_VI_FRAME;

    if (frm->is_i_refresh)
        info->frame_type = INTRA_RFH_FRAME;

    p->next_ratio = 0;
    if (p->last_frame_type == INTRA_FRAME) {
        calc_next_i_ratio(p);
    }

    if (!p->first_frm_flg) {
        if (p->calc_ratio)
            p->calc_ratio(p, info);
    } else {
        bits_model_alloc(p, info, p->gop_total_bits);
        /* quality determination */
        info->quality_target = (usr_cfg->init_quality <= 0) ? -1 : usr_cfg->init_quality;
    }

    if (frm->is_intra) {
        info->quality_max = usr_cfg->max_i_quality;
        info->quality_min = usr_cfg->min_i_quality;
    } else {
        info->quality_max = usr_cfg->max_quality;
        info->quality_min = usr_cfg->min_quality;
    }

    bits_model_preset(p, info);

    rc_dbg_rc("seq_idx %d intra %d\n", frm->seq_idx, frm->is_intra);
    rc_dbg_rc("bitrate [%d : %d : %d]\n", info->bit_min, info->bit_target, info->bit_max);
    rc_dbg_rc("quality [%d : %d : %d]\n", info->quality_min, info->quality_target, info->quality_max);

    p->reenc_cnt = 0;
    p->last_frame_type = info->frame_type;

    rc_dbg_func("leave %p\n", ctx);

    return MPP_OK;
}